

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O0

bool __thiscall
glcts::TextureBorderClampSamplingTexture<float,_unsigned_char>::checkNearest
          (TextureBorderClampSamplingTexture<float,_unsigned_char> *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,uchar expectedValue,
          uchar expectedBorderColor,GLint layer)

{
  uint uVar1;
  GLuint GVar2;
  GLuint GVar3;
  deUint32 b;
  deUint32 a;
  GLuint GVar4;
  deUint32 dVar5;
  int iVar6;
  byte *pbVar7;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  ulong uVar10;
  size_type sVar11;
  reference pvVar12;
  uint local_418;
  uint local_414;
  MessageBuilder local_410;
  uint local_290;
  uint local_28c;
  GLuint i_1;
  GLuint j;
  pair<unsigned_int,_unsigned_int> local_280;
  uint local_278;
  uint local_274;
  pair<unsigned_int,_unsigned_int> local_270;
  uint local_268;
  uint local_264;
  pair<unsigned_int,_unsigned_int> local_260;
  uint local_258;
  uint local_254;
  pair<unsigned_int,_unsigned_int> local_250;
  uint local_248;
  uint local_244;
  pair<unsigned_int,_unsigned_int> local_240;
  uint local_238;
  uint local_234;
  pair<unsigned_int,_unsigned_int> local_230;
  uint local_228;
  uint local_224;
  pair<unsigned_int,_unsigned_int> local_220;
  uint local_218;
  uint local_214;
  pair<unsigned_int,_unsigned_int> local_210;
  undefined1 local_208 [8];
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  borderPoints;
  uint local_1e8 [4];
  MessageBuilder local_1d8;
  uint local_54;
  uint local_50;
  GLuint i;
  pair<unsigned_int,_unsigned_int> local_48;
  pair<unsigned_int,_unsigned_int> centerPoint;
  GLuint index;
  GLuint outRowWidth;
  GLuint out_components;
  GLuint in_components;
  GLuint height;
  GLuint width;
  GLint layer_local;
  uchar expectedBorderColor_local;
  uchar expectedValue_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer_local;
  TextureBorderClampSamplingTexture<float,_unsigned_char> *this_local;
  
  height = layer;
  width._2_1_ = expectedBorderColor;
  width._3_1_ = expectedValue;
  _layer_local = buffer;
  buffer_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this;
  GVar2 = TestConfiguration<float,_unsigned_char>::get_width(&this->m_test_configuration);
  GVar3 = TestConfiguration<float,_unsigned_char>::get_height(&this->m_test_configuration);
  b = TestConfiguration<float,_unsigned_char>::get_n_in_components(&this->m_test_configuration);
  a = TestConfiguration<float,_unsigned_char>::get_n_out_components(&this->m_test_configuration);
  GVar4 = TestConfiguration<float,_unsigned_char>::get_width(&this->m_test_configuration);
  centerPoint.second = GVar4 * a;
  centerPoint.first = 0;
  i = GVar2 >> 1;
  local_50 = GVar3 >> 1;
  std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
            (&local_48,&i,&local_50);
  local_54 = 0;
  do {
    uVar1 = local_54;
    dVar5 = deMinu32(a,b);
    if (dVar5 <= uVar1) {
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                *)local_208);
      local_214 = GVar2 / 6;
      local_218 = GVar3 / 6;
      std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
                (&local_210,&local_214,&local_218);
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_208,&local_210);
      local_224 = GVar2 >> 1;
      local_228 = GVar3 / 6;
      std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
                (&local_220,&local_224,&local_228);
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_208,&local_220);
      local_234 = (uint)(long)(((double)GVar2 / 6.0) * 5.0);
      local_238 = GVar3 / 6;
      std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
                (&local_230,&local_234,&local_238);
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_208,&local_230);
      local_244 = GVar2 / 6;
      local_248 = GVar3 >> 1;
      std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
                (&local_240,&local_244,&local_248);
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_208,&local_240);
      local_254 = (uint)(long)(((double)GVar2 / 6.0) * 5.0);
      local_258 = GVar3 >> 1;
      std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
                (&local_250,&local_254,&local_258);
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_208,&local_250);
      local_264 = GVar2 / 6;
      local_268 = (uint)(long)(((double)GVar3 / 6.0) * 5.0);
      std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
                (&local_260,&local_264,&local_268);
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_208,&local_260);
      local_274 = GVar2 >> 1;
      local_278 = (uint)(long)(((double)GVar3 / 6.0) * 5.0);
      std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
                (&local_270,&local_274,&local_278);
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_208,&local_270);
      j = (GLuint)(long)(((double)GVar2 / 6.0) * 5.0);
      i_1 = (GLuint)(long)(((double)GVar3 / 6.0) * 5.0);
      std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int,_unsigned_int,_true>
                (&local_280,&j,&i_1);
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::push_back((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)local_208,&local_280);
      local_28c = 0;
      while( true ) {
        uVar10 = (ulong)local_28c;
        sVar11 = std::
                 vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ::size((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                         *)local_208);
        if (sVar11 <= uVar10) break;
        local_290 = 0;
        while( true ) {
          uVar1 = local_290;
          dVar5 = deMinu32(a,b);
          if (dVar5 <= uVar1) break;
          pvVar12 = std::
                    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  *)local_208,(ulong)local_28c);
          iVar6 = pvVar12->second * centerPoint.second;
          pvVar12 = std::
                    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                  *)local_208,(ulong)local_28c);
          centerPoint.first = iVar6 + pvVar12->first * a + local_290;
          pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (_layer_local,(ulong)centerPoint.first);
          if (*pbVar7 != width._2_1_) {
            pTVar8 = tcu::TestContext::getLog
                               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_410,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar9 = tcu::MessageBuilder::operator<<
                               (&local_410,(char (*) [24])"Wrong value for layer (");
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&height);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [22])") at point (x,y)  = (");
            pvVar12 = std::
                      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    *)local_208,(ulong)local_28c);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&pvVar12->first);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c5c975);
            pvVar12 = std::
                      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ::operator[]((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                    *)local_208,(ulong)local_28c);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&pvVar12->second);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [16])") , component (");
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_290);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2c1ee60);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [17])"Expected value [");
            local_414 = (uint)width._2_1_;
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_414);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b2eb07);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [17])"Result   value [");
            pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (_layer_local,(ulong)centerPoint.first);
            local_418 = (uint)*pbVar7;
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&local_418);
            pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b2eb07);
            tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_410);
            this_local._7_1_ = 0;
            goto LAB_0154b4da;
          }
          local_290 = local_290 + 1;
        }
        local_28c = local_28c + 1;
      }
      this_local._7_1_ = 1;
LAB_0154b4da:
      std::
      vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::~vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)local_208);
LAB_0154b4f6:
      return (bool)(this_local._7_1_ & 1);
    }
    centerPoint.first = local_48.second * centerPoint.second + local_48.first * a + local_54;
    pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (_layer_local,(ulong)centerPoint.first);
    if (*pbVar7 != width._3_1_) {
      pTVar8 = tcu::TestContext::getLog
                         ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1d8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar9 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [24])"Wrong value for layer (");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)&height);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [22])") at point (x,y)  = (");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_48.first);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2c5c975);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_48.second);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [16])") , component (");
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_54);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2c1ee60);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [17])"Expected value [");
      local_1e8[0] = (uint)width._3_1_;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(int *)local_1e8);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b2eb07);
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [17])"Result   value [");
      pbVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (_layer_local,(ulong)centerPoint.first);
      borderPoints.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)*pbVar7;
      pMVar9 = tcu::MessageBuilder::operator<<
                         (pMVar9,(int *)((long)&borderPoints.
                                                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                        4));
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [3])0x2b2eb07);
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1d8);
      this_local._7_1_ = 0;
      goto LAB_0154b4f6;
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

bool TextureBorderClampSamplingTexture<InputType, OutputType>::checkNearest(std::vector<OutputType>& buffer,
																			OutputType expectedValue,
																			OutputType expectedBorderColor,
																			glw::GLint layer)
{
	glw::GLuint width		   = m_test_configuration.get_width();
	glw::GLuint height		   = m_test_configuration.get_height();
	glw::GLuint in_components  = m_test_configuration.get_n_in_components();
	glw::GLuint out_components = m_test_configuration.get_n_out_components();
	glw::GLuint outRowWidth	= m_test_configuration.get_width() * out_components;
	glw::GLuint index		   = 0;

	/* Check if center point is equal to expectedValue */
	std::pair<glw::GLuint, glw::GLuint> centerPoint(width / 2, height / 2);

	for (glw::GLuint i = 0; i < deMinu32(out_components, in_components); ++i)
	{
		index = centerPoint.second * outRowWidth + centerPoint.first * out_components + i;
		if (buffer[index] != expectedValue)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Wrong value for layer (" << layer << ") at point (x,y)  = ("
							   << centerPoint.first << "," << centerPoint.second << ") , component (" << i << ")\n"
							   << "Expected value [" << (glw::GLint)expectedValue << "]\n"
							   << "Result   value [" << (glw::GLint)buffer[index] << "]\n"
							   << tcu::TestLog::EndMessage;
			return false;
		}
	}

	/* Check if following points (marked as BC) contain values equal border color
	 *
	 *                 (-1, -1)    (0, -1)  (1,  -1)     (2, -1)
	 *                         *-------+-------+-------*
	 *                         |       |       |       |
	 *                         |  BC   |  BC   |   BC  |
	 *                         |       |       |       |
	 *                 (-1, 0) +-------+-------+-------+ (2, 0)
	 *                         |       |       |       |
	 *                         |  BC   |   0   |   BC  |
	 *                         |       |       |       |
	 *                 (-1, 1) +-------+-------+-------+ (2, 1)
	 *                         |       |       |       |
	 *                         |  BC   |  BC   |   BC  |
	 *                         |       |       |       |
	 *                         *-------+-------+-------*
	 *                 (-1, 2)      (0, 2)  (1, 2)       (2, 2)
	 */

	std::vector<std::pair<glw::GLuint, glw::GLuint> > borderPoints;

	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 6, height / 6));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 2, height / 6));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>((glw::GLuint)(width / 6.0 * 5), height / 6));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 6, height / 2));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>((glw::GLuint)(width / 6.0 * 5), height / 2));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 6, (glw::GLuint)(height / 6.0 * 5)));
	borderPoints.push_back(std::pair<glw::GLuint, glw::GLuint>(width / 2, (glw::GLuint)(height / 6.0 * 5)));
	borderPoints.push_back(
		std::pair<glw::GLuint, glw::GLuint>((glw::GLuint)(width / 6.0 * 5), (glw::GLuint)(height / 6.0 * 5)));

	for (glw::GLuint j = 0; j < borderPoints.size(); ++j)
	{
		for (glw::GLuint i = 0; i < deMinu32(out_components, in_components); ++i)
		{
			index = borderPoints[j].second * outRowWidth + borderPoints[j].first * out_components + i;
			if (buffer[index] != expectedBorderColor)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Wrong value for layer (" << layer
								   << ") at point (x,y)  = (" << borderPoints[j].first << "," << borderPoints[j].second
								   << ") , component (" << i << ")\n"
								   << "Expected value [" << (glw::GLint)expectedBorderColor << "]\n"
								   << "Result   value [" << (glw::GLint)buffer[index] << "]\n"
								   << tcu::TestLog::EndMessage;
				return false;
			}
		}
	}

	return true;
}